

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
calc_kurtosis_all_data<InputData<float,long>,long_double>
          (InputData<float,_long> *input_data,ModelParams *model_params,Xoshiro256PP *rnd_generator)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  ulong uVar5;
  reference pvVar6;
  reference pdVar7;
  vector<double,_std::allocator<double>_> *in_RCX;
  float *in_RDX;
  long *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar8;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  float *in_stack_00000020;
  size_t col_1;
  double *w;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  size_t col;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> buffer_size_t;
  unique_ptr<double[],_std::default_delete<double[]>_> buffer_double;
  vector<double,_std::allocator<double>_> *kurt_weights;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb8;
  undefined4 uVar9;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec0;
  allocator_type *in_stack_fffffffffffffed0;
  size_type in_stack_fffffffffffffed8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee0;
  long in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  size_t *in_stack_fffffffffffffef8;
  long lVar10;
  int *x;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar11;
  CategSplit cat_split_type;
  double in_stack_ffffffffffffff20;
  Xoshiro256PP *in_stack_ffffffffffffff28;
  void *in_stack_ffffffffffffff60;
  vector<double,_std::allocator<double>_> *pvVar12;
  int *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff90;
  float *in_stack_ffffffffffffff98;
  float *w_00;
  MissingAction in_stack_ffffffffffffffac;
  size_t in_stack_ffffffffffffffb0;
  float *in_stack_ffffffffffffffb8;
  MissingAction in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  MissingAction in_stack_ffffffffffffffdc;
  vector<double,_std::allocator<double>_> *Xc;
  int ncat;
  
  pvVar12 = in_RDI;
  Xc = in_RDI;
  std::unique_ptr<double[],std::default_delete<double[]>>::
  unique_ptr<std::default_delete<double[]>,void>
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffec0);
  std::unique_ptr<unsigned_long[],std::default_delete<unsigned_long[]>>::
  unique_ptr<std::default_delete<unsigned_long[]>,void>
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
             in_stack_fffffffffffffec0);
  if (in_RSI[5] != 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(int)in_RSI[4];
    uVar5 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    in_stack_ffffffffffffff60 = operator_new__(uVar5);
    std::unique_ptr<double[],std::default_delete<double[]>>::
    unique_ptr<double*,std::default_delete<double[]>,void,bool>
              ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffec0,
               (double *)in_stack_fffffffffffffeb8);
    std::unique_ptr<double[],_std::default_delete<double[]>_>::operator=
              ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffec0,
               (unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffeb8);
    std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
              ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffec0);
    if ((in_RSI[8] == 0) || ((*(byte *)(in_RSI + 9) & 1) != 0)) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)((int)in_RSI[4] + 1);
      uVar5 = SUB168(auVar3 * ZEXT816(8),0);
      if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      operator_new__(uVar5);
      std::unique_ptr<unsigned_long[],std::default_delete<unsigned_long[]>>::
      unique_ptr<unsigned_long*,std::default_delete<unsigned_long[]>,void,bool>
                ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                 in_stack_fffffffffffffec0,(unsigned_long *)in_stack_fffffffffffffeb8);
      std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator=
                ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                 in_stack_fffffffffffffec0,
                 (unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                 in_stack_fffffffffffffeb8);
      std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
                ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                 in_stack_fffffffffffffec0);
    }
  }
  in_stack_ffffffffffffffac = in_stack_ffffffffffffffac & 0xffffff;
  std::allocator<double>::allocator((allocator<double> *)0x5426f0);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::allocator<double>::~allocator((allocator<double> *)0x54271c);
  for (w_00 = (float *)0x0; cat_split_type = SUB84(in_stack_ffffffffffffff20,0),
      w_00 < (float *)in_RSI[7]; w_00 = (float *)((long)w_00 + 1)) {
    if (w_00 < (float *)in_RSI[1]) {
      if (in_RSI[0xd] == 0) {
        if ((in_RSI[8] == 0) || ((*(byte *)(in_RSI + 9) & 1) != 0)) {
          dVar8 = calc_kurtosis<float,long_double>(in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffdc);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(size_type)w_00);
          *pvVar6 = dVar8;
        }
        else {
          dVar8 = calc_kurtosis_weighted<float,long_double>
                            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                             in_stack_ffffffffffffffac,w_00);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(size_type)w_00);
          *pvVar6 = dVar8;
        }
      }
      else if ((in_RSI[8] == 0) || ((*(byte *)(in_RSI + 9) & 1) != 0)) {
        dVar8 = calc_kurtosis<float,long,long_double>
                          ((size_t)Xc,(size_t)in_RSI,in_RDX,(long *)in_RCX,
                           (long *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                           in_stack_ffffffffffffffd4);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(size_type)w_00);
        *pvVar6 = dVar8;
      }
      else {
        in_stack_fffffffffffffeb8 = (vector<double,_std::allocator<double>_> *)in_RSI[8];
        in_stack_ffffffffffffff28 =
             (Xoshiro256PP *)
             calc_kurtosis_weighted<float,long,long_double>
                       (in_stack_00000008,unaff_retaddr,(float *)Xc,in_RSI,(long *)in_RDX,
                        (MissingAction)((ulong)in_RCX >> 0x20),in_stack_00000020);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(size_type)w_00);
        *pvVar6 = (value_type)in_stack_ffffffffffffff28;
      }
    }
    else if ((in_RSI[8] == 0) || ((*(byte *)(in_RSI + 9) & 1) != 0)) {
      lVar10 = in_RSI[6];
      x = (int *)(in_RSI[2] + ((long)w_00 - in_RSI[1]) * lVar10 * 4);
      uVar11 = *(undefined4 *)(in_RSI[3] + ((long)w_00 - in_RSI[1]) * 4);
      std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::get
                ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                 in_stack_fffffffffffffec0);
      ncat = (int)((ulong)lVar10 >> 0x20);
      uVar9 = (undefined4)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
      std::unique_ptr<double[],_std::default_delete<double[]>_>::get
                ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffec0);
      in_stack_fffffffffffffec0 = in_RCX;
      in_stack_fffffffffffffeb8 =
           (vector<double,_std::allocator<double>_> *)CONCAT44(uVar9,in_RDX[0x20]);
      in_RCX = in_stack_fffffffffffffec0;
      in_stack_ffffffffffffff20 =
           calc_kurtosis<long_double>
                     (CONCAT44(uVar11,in_stack_ffffffffffffff10),x,ncat,in_stack_fffffffffffffef8,
                      (double *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      (MissingAction)((ulong)in_stack_fffffffffffffee8 >> 0x20),cat_split_type,
                      in_stack_ffffffffffffff28);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(size_type)w_00);
      *pvVar6 = in_stack_ffffffffffffff20;
    }
    else {
      in_stack_fffffffffffffee8 = in_RSI[2] + ((long)w_00 - in_RSI[1]) * in_RSI[6] * 4;
      in_stack_fffffffffffffef4 = *(undefined4 *)(in_RSI[3] + ((long)w_00 - in_RSI[1]) * 4);
      in_stack_fffffffffffffeb8 = in_RCX;
      std::unique_ptr<double[],_std::default_delete<double[]>_>::get
                ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffec0);
      in_stack_fffffffffffffec0 = (vector<double,_std::allocator<double>_> *)in_RSI[8];
      in_RCX = in_stack_fffffffffffffeb8;
      in_stack_fffffffffffffef8 =
           (size_t *)
           calc_kurtosis_weighted<float,long_double>
                     (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                      (int)((ulong)pvVar12 >> 0x20),(double *)in_RDI,
                      (MissingAction)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                      (CategSplit)in_stack_ffffffffffffff60,
                      (Xoshiro256PP *)in_stack_ffffffffffffff90._M_current,in_stack_ffffffffffffff98
                     );
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(size_type)w_00);
      *pvVar6 = (value_type)in_stack_fffffffffffffef8;
    }
  }
  std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffeb8);
  std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffeb8);
  while (bVar4 = __gnu_cxx::operator!=
                           ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)in_stack_fffffffffffffec0,
                            (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)in_stack_fffffffffffffeb8), bVar4) {
    pdVar7 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )&stack0xffffffffffffff90);
    if ((*pdVar7 != -INFINITY) || (NAN(*pdVar7))) {
      dVar8 = *pdVar7 + -1.0;
      if (dVar8 <= 1e-08) {
        dVar8 = 1e-08;
      }
    }
    else {
      dVar8 = 0.0;
    }
    *pdVar7 = dVar8;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               &stack0xffffffffffffff90);
  }
  if (in_RSI[10] != 0) {
    for (uVar5 = 0; uVar5 < (ulong)in_RSI[7]; uVar5 = uVar5 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,uVar5);
      if (0.0 < *pvVar6) {
        fVar1 = *(float *)(in_RSI[10] + uVar5 * 4);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,uVar5);
        *pvVar6 = (double)fVar1 * *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,uVar5);
        dVar8 = *pvVar6;
        if (dVar8 <= 1e-100) {
          dVar8 = 1e-100;
        }
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,uVar5);
        *pvVar6 = dVar8;
      }
    }
  }
  std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
             in_stack_fffffffffffffec0);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffec0);
  return pvVar12;
}

Assistant:

std::vector<double> calc_kurtosis_all_data(InputData &input_data, ModelParams &model_params, RNG_engine &rnd_generator)
{
    std::unique_ptr<double[]> buffer_double;
    std::unique_ptr<size_t[]> buffer_size_t;
    if (input_data.ncols_categ)
    {
        buffer_double = std::unique_ptr<double[]>(new double[input_data.max_categ]);
        if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
            buffer_size_t = std::unique_ptr<size_t[]>(new size_t[input_data.max_categ + 1]);
    }


    std::vector<double> kurt_weights(input_data.ncols_numeric + input_data.ncols_categ);
    for (size_t col = 0; col < input_data.ncols_tot; col++)
    {
        if (col < input_data.ncols_numeric)
        {
            if (input_data.Xc_indptr == NULL)
            {
                if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
                {
                    kurt_weights[col]
                        = calc_kurtosis<typename std::remove_pointer<decltype(input_data.numeric_data)>::type, ldouble_safe>(
                                        input_data.numeric_data + col * input_data.nrows,
                                        input_data.nrows, model_params.missing_action);
                }

                else
                {
                    kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                                 ldouble_safe>(
                                                 input_data.numeric_data + col * input_data.nrows, input_data.nrows,
                                                 model_params.missing_action, input_data.sample_weights);
                }
            }

            else
            {
                if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
                {
                    kurt_weights[col]
                        = calc_kurtosis<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                        typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                        ldouble_safe>(
                                        col, input_data.nrows,
                                        input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                        model_params.missing_action);
                }

                else
                {
                    kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                                 typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                                 ldouble_safe>(
                                                 col, input_data.nrows,
                                                 input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                                 model_params.missing_action, input_data.sample_weights);
                }
            }
        }

        else
        {
            if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
            {
                kurt_weights[col]
                        = calc_kurtosis<ldouble_safe>(input_data.nrows,
                                        input_data.categ_data + (col- input_data.ncols_numeric) * input_data.nrows,
                                        input_data.ncat[col - input_data.ncols_numeric],
                                        buffer_size_t.get(), buffer_double.get(),
                                        model_params.missing_action, model_params.cat_split_type, rnd_generator);
            }

            else
            {
                kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.sample_weights)>::type,
                                                 ldouble_safe>(
                                                 input_data.nrows,
                                                 input_data.categ_data + (col- input_data.ncols_numeric) * input_data.nrows,
                                                 input_data.ncat[col - input_data.ncols_numeric],
                                                 buffer_double.get(),
                                                 model_params.missing_action, model_params.cat_split_type,
                                                 rnd_generator, input_data.sample_weights);
            }
        }
    }

    for (auto &w : kurt_weights) w = (w == -HUGE_VAL)? 0. : std::fmax(1e-8, -1. + w);
    if (input_data.col_weights != NULL)
    {
        for (size_t col = 0; col < input_data.ncols_tot; col++)
        {
            if (kurt_weights[col] <= 0) continue;
            kurt_weights[col] *= input_data.col_weights[col];
            kurt_weights[col] = std::fmax(kurt_weights[col], 1e-100);
        }
    }

    return kurt_weights;
}